

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int SMCompatible_Sparse(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  long *in_RSI;
  long *in_RDI;
  SUNMatrix in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  SVar1 = SUNMatGetID((SUNMatrix)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((SVar1 != SUNMATRIX_SPARSE) ||
     (SVar1 = SUNMatGetID((SUNMatrix)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
     SVar1 != SUNMATRIX_SPARSE)) {
    return 0;
  }
  sVar2 = SUNSparseMatrix_Rows(in_stack_ffffffffffffffd8);
  sVar3 = SUNSparseMatrix_Rows(in_stack_ffffffffffffffd8);
  if (sVar2 != sVar3) {
    return 0;
  }
  sVar2 = SUNSparseMatrix_Columns(in_stack_ffffffffffffffd8);
  sVar3 = SUNSparseMatrix_Columns(in_stack_ffffffffffffffd8);
  if (sVar2 != sVar3) {
    return 0;
  }
  if (*(int *)(*in_RDI + 0x18) != *(int *)(*in_RSI + 0x18)) {
    return 0;
  }
  return 1;
}

Assistant:

static booleantype SMCompatible_Sparse(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be sparse */
  if ( (SUNMatGetID(A) != SUNMATRIX_SPARSE) ||
       (SUNMatGetID(B) != SUNMATRIX_SPARSE) )
    return SUNFALSE;

  /* both matrices must have the same shape and sparsity type */
  if (SUNSparseMatrix_Rows(A) != SUNSparseMatrix_Rows(B))
    return SUNFALSE;
  if (SUNSparseMatrix_Columns(A) != SUNSparseMatrix_Columns(B))
    return SUNFALSE;
  if (SM_SPARSETYPE_S(A) != SM_SPARSETYPE_S(B))
    return SUNFALSE;

  return SUNTRUE;
}